

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deserializer.hpp
# Opt level: O1

vector<duckdb::BlockPointer,_true> * __thiscall
duckdb::Deserializer::ReadPropertyWithExplicitDefault<duckdb::vector<duckdb::BlockPointer,true>>
          (vector<duckdb::BlockPointer,_true> *__return_storage_ptr__,Deserializer *this,
          field_id_t field_id,char *tag,vector<duckdb::BlockPointer,_true> *default_value)

{
  pointer *ppBVar1;
  iterator __position;
  pointer pBVar2;
  int iVar3;
  undefined4 extraout_var;
  undefined6 in_register_00000012;
  vector<duckdb::BlockPointer,_true> *vec;
  long lVar4;
  BlockPointer BVar5;
  BlockPointer local_40;
  
  iVar3 = (*this->_vptr_Deserializer[4])
                    (this,CONCAT62(in_register_00000012,field_id) & 0xffffffff,tag);
  if ((char)iVar3 == '\0') {
    (*this->_vptr_Deserializer[5])(this,0);
    pBVar2 = (default_value->
             super_vector<duckdb::BlockPointer,_std::allocator<duckdb::BlockPointer>_>).
             super__Vector_base<duckdb::BlockPointer,_std::allocator<duckdb::BlockPointer>_>._M_impl
             .super__Vector_impl_data._M_finish;
    (__return_storage_ptr__->
    super_vector<duckdb::BlockPointer,_std::allocator<duckdb::BlockPointer>_>).
    super__Vector_base<duckdb::BlockPointer,_std::allocator<duckdb::BlockPointer>_>._M_impl.
    super__Vector_impl_data._M_start =
         (default_value->super_vector<duckdb::BlockPointer,_std::allocator<duckdb::BlockPointer>_>).
         super__Vector_base<duckdb::BlockPointer,_std::allocator<duckdb::BlockPointer>_>._M_impl.
         super__Vector_impl_data._M_start;
    (__return_storage_ptr__->
    super_vector<duckdb::BlockPointer,_std::allocator<duckdb::BlockPointer>_>).
    super__Vector_base<duckdb::BlockPointer,_std::allocator<duckdb::BlockPointer>_>._M_impl.
    super__Vector_impl_data._M_finish = pBVar2;
    (__return_storage_ptr__->
    super_vector<duckdb::BlockPointer,_std::allocator<duckdb::BlockPointer>_>).
    super__Vector_base<duckdb::BlockPointer,_std::allocator<duckdb::BlockPointer>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage =
         (default_value->super_vector<duckdb::BlockPointer,_std::allocator<duckdb::BlockPointer>_>).
         super__Vector_base<duckdb::BlockPointer,_std::allocator<duckdb::BlockPointer>_>._M_impl.
         super__Vector_impl_data._M_end_of_storage;
    (default_value->super_vector<duckdb::BlockPointer,_std::allocator<duckdb::BlockPointer>_>).
    super__Vector_base<duckdb::BlockPointer,_std::allocator<duckdb::BlockPointer>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    (default_value->super_vector<duckdb::BlockPointer,_std::allocator<duckdb::BlockPointer>_>).
    super__Vector_base<duckdb::BlockPointer,_std::allocator<duckdb::BlockPointer>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    (default_value->super_vector<duckdb::BlockPointer,_std::allocator<duckdb::BlockPointer>_>).
    super__Vector_base<duckdb::BlockPointer,_std::allocator<duckdb::BlockPointer>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  }
  else {
    (__return_storage_ptr__->
    super_vector<duckdb::BlockPointer,_std::allocator<duckdb::BlockPointer>_>).
    super__Vector_base<duckdb::BlockPointer,_std::allocator<duckdb::BlockPointer>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    (__return_storage_ptr__->
    super_vector<duckdb::BlockPointer,_std::allocator<duckdb::BlockPointer>_>).
    super__Vector_base<duckdb::BlockPointer,_std::allocator<duckdb::BlockPointer>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    (__return_storage_ptr__->
    super_vector<duckdb::BlockPointer,_std::allocator<duckdb::BlockPointer>_>).
    super__Vector_base<duckdb::BlockPointer,_std::allocator<duckdb::BlockPointer>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    iVar3 = (*this->_vptr_Deserializer[8])(this);
    lVar4 = CONCAT44(extraout_var,iVar3);
    if (lVar4 != 0) {
      do {
        (*this->_vptr_Deserializer[6])(this);
        BVar5 = BlockPointer::Deserialize(this);
        (*this->_vptr_Deserializer[7])(this);
        __position._M_current =
             (__return_storage_ptr__->
             super_vector<duckdb::BlockPointer,_std::allocator<duckdb::BlockPointer>_>).
             super__Vector_base<duckdb::BlockPointer,_std::allocator<duckdb::BlockPointer>_>._M_impl
             .super__Vector_impl_data._M_finish;
        local_40 = BVar5;
        if (__position._M_current ==
            (__return_storage_ptr__->
            super_vector<duckdb::BlockPointer,_std::allocator<duckdb::BlockPointer>_>).
            super__Vector_base<duckdb::BlockPointer,_std::allocator<duckdb::BlockPointer>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage) {
          ::std::vector<duckdb::BlockPointer,_std::allocator<duckdb::BlockPointer>_>::
          _M_realloc_insert<duckdb::BlockPointer>
                    (&__return_storage_ptr__->
                      super_vector<duckdb::BlockPointer,_std::allocator<duckdb::BlockPointer>_>,
                     __position,&local_40);
        }
        else {
          local_40.block_id = BVar5.block_id;
          local_40._8_8_ = BVar5._8_8_;
          (__position._M_current)->block_id = local_40.block_id;
          (__position._M_current)->offset = local_40.offset;
          (__position._M_current)->unused_padding = local_40.unused_padding;
          ppBVar1 = &(__return_storage_ptr__->
                     super_vector<duckdb::BlockPointer,_std::allocator<duckdb::BlockPointer>_>).
                     super__Vector_base<duckdb::BlockPointer,_std::allocator<duckdb::BlockPointer>_>
                     ._M_impl.super__Vector_impl_data._M_finish;
          *ppBVar1 = *ppBVar1 + 1;
        }
        lVar4 = lVar4 + -1;
      } while (lVar4 != 0);
    }
    (*this->_vptr_Deserializer[9])(this);
    (*this->_vptr_Deserializer[5])(this,1);
  }
  return __return_storage_ptr__;
}

Assistant:

inline T ReadPropertyWithExplicitDefault(const field_id_t field_id, const char *tag, T default_value) {
		if (!OnOptionalPropertyBegin(field_id, tag)) {
			OnOptionalPropertyEnd(false);
			return std::forward<T>(default_value);
		}
		auto ret = Read<T>();
		OnOptionalPropertyEnd(true);
		return ret;
	}